

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

pair<unsigned_long,_bool> __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
::find_or_prepare_insert<cs_impl::any>
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
           *this,any *key,size_t hashval)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  proxy *ppVar3;
  proxy *ppVar4;
  uint uVar5;
  bool bVar6;
  ushort uVar7;
  int iVar8;
  uint uVar9;
  undefined8 extraout_RDX;
  undefined8 uVar10;
  ulong uVar11;
  long lVar12;
  size_t sVar13;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  __m128i match;
  undefined1 auVar21 [16];
  pair<unsigned_long,_bool> pVar22;
  char cVar14;
  char cVar18;
  char cVar19;
  char cVar20;
  
  uVar2 = this->capacity_;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x96,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
  }
  uVar11 = hashval >> 7;
  auVar15 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
  auVar16 = pshuflw(auVar15,auVar15,0);
  lVar12 = 0;
  auVar15 = _DAT_001e13a0;
  do {
    uVar11 = uVar11 & uVar2;
    auVar1 = *(undefined1 (*) [16])(this->ctrl_ + uVar11);
    cVar14 = auVar16[0];
    auVar17[0] = -(cVar14 == auVar1[0]);
    cVar18 = auVar16[1];
    auVar17[1] = -(cVar18 == auVar1[1]);
    cVar19 = auVar16[2];
    auVar17[2] = -(cVar19 == auVar1[2]);
    cVar20 = auVar16[3];
    auVar17[3] = -(cVar20 == auVar1[3]);
    auVar17[4] = -(cVar14 == auVar1[4]);
    auVar17[5] = -(cVar18 == auVar1[5]);
    auVar17[6] = -(cVar19 == auVar1[6]);
    auVar17[7] = -(cVar20 == auVar1[7]);
    auVar17[8] = -(cVar14 == auVar1[8]);
    auVar17[9] = -(cVar18 == auVar1[9]);
    auVar17[10] = -(cVar19 == auVar1[10]);
    auVar17[0xb] = -(cVar20 == auVar1[0xb]);
    auVar17[0xc] = -(cVar14 == auVar1[0xc]);
    auVar17[0xd] = -(cVar18 == auVar1[0xd]);
    auVar17[0xe] = -(cVar19 == auVar1[0xe]);
    cVar14 = auVar1[0xf];
    auVar17[0xf] = -(cVar20 == cVar14);
    uVar7 = (ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe | (ushort)(auVar17[0xf] >> 7) << 0xf;
    if (uVar7 != 0) {
      uVar9 = (uint)uVar7;
      do {
        uVar5 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        sVar13 = uVar5 + uVar11 & uVar2;
        ppVar3 = this->slots_[sVar13].mDat;
        ppVar4 = key->mDat;
        if (ppVar4 == (proxy *)0x0 || ppVar3 == (proxy *)0x0) {
          if (ppVar3 == (proxy *)0x0 && ppVar4 == (proxy *)0x0) {
LAB_001a38db:
            uVar10 = 0;
            goto LAB_001a38ef;
          }
        }
        else {
          iVar8 = (*ppVar3->data->_vptr_baseHolder[4])(ppVar3->data,ppVar4->data);
          auVar15 = _DAT_001e13a0;
          if ((char)iVar8 != '\0') goto LAB_001a38db;
        }
        uVar9 = uVar9 - 1 & uVar9;
      } while (uVar9 != 0);
    }
    auVar21[0] = -(auVar1[0] == auVar15[0]);
    auVar21[1] = -(auVar1[1] == auVar15[1]);
    auVar21[2] = -(auVar1[2] == auVar15[2]);
    auVar21[3] = -(auVar1[3] == auVar15[3]);
    auVar21[4] = -(auVar1[4] == auVar15[4]);
    auVar21[5] = -(auVar1[5] == auVar15[5]);
    auVar21[6] = -(auVar1[6] == auVar15[6]);
    auVar21[7] = -(auVar1[7] == auVar15[7]);
    auVar21[8] = -(auVar1[8] == auVar15[8]);
    auVar21[9] = -(auVar1[9] == auVar15[9]);
    auVar21[10] = -(auVar1[10] == auVar15[10]);
    auVar21[0xb] = -(auVar1[0xb] == auVar15[0xb]);
    auVar21[0xc] = -(auVar1[0xc] == auVar15[0xc]);
    auVar21[0xd] = -(auVar1[0xd] == auVar15[0xd]);
    auVar21[0xe] = -(auVar1[0xe] == auVar15[0xe]);
    bVar6 = cVar14 == auVar15[0xf];
    auVar21[0xf] = -bVar6;
    if ((((((((((((((((auVar21 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar21 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar21 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar21 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar21 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar21 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar21 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar21 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar21 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar21 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar21 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar21 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar21 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar21 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar21 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar6) {
      sVar13 = prepare_insert(this,hashval);
      uVar10 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
LAB_001a38ef:
      pVar22._8_8_ = uVar10;
      pVar22.first = sVar13;
      return pVar22;
    }
    uVar11 = uVar11 + lVar12 + 0x10;
    lVar12 = lVar12 + 0x10;
  } while( true );
}

Assistant:

probe_seq<Group::kWidth> probe(size_t hashval) const
			{
				return probe_seq<Group::kWidth>(H1(hashval, ctrl_), capacity_);
			}